

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.h
# Opt level: O0

int replay_match_victim_pedigree(__cilkrts_worker *w,__cilkrts_worker *victim)

{
  __cilkrts_worker *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (*(int *)(*(long *)(in_RDI + 0x30) + 0x498) == 2) {
    local_4 = replay_match_victim_pedigree_internal(in_RSI,(__cilkrts_worker *)0x11716b);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

__CILKRTS_INLINE
int replay_match_victim_pedigree(__cilkrts_worker *w, __cilkrts_worker *victim)
{
    // We're not replaying a log. The victim is always acceptable
    if (REPLAY_LOG != w->g->record_or_replay)
        return 1;

    // Return 1 if the victim's pedigree matches the frame the worker stole
    // when we recorded the log
    return replay_match_victim_pedigree_internal(w, victim);
}